

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_av.c
# Opt level: O0

dtl_error_t dtl_av_insertion_sort(dtl_av_t *self,_Bool reverse)

{
  dtl_sv_t *pdVar1;
  dtl_sv_t *other;
  int iVar2;
  dtl_dv_type_id dVar3;
  dtl_dv_type_id dVar4;
  dtl_error_t dVar5;
  int local_4c;
  int32_t i;
  dtl_dv_t *right;
  dtl_dv_t *left;
  dtl_dv_type_id rightType;
  dtl_dv_type_id leftType;
  dtl_error_t errorCode;
  int iStack_20;
  _Bool result;
  int32_t unsortedStart;
  int32_t arrayLen;
  _Bool reverse_local;
  dtl_av_t *self_local;
  
  iStack_20 = self->pAny->s32CurLen;
  if (1 < iStack_20) {
    unsortedStart._3_1_ = reverse;
    _arrayLen = self;
    for (errorCode = 1; errorCode < iStack_20; errorCode = errorCode + 1) {
      leftType._3_1_ = DTL_DV_INVALID >> 0x18;
      pdVar1 = (dtl_sv_t *)_arrayLen->pAny->pFirst[errorCode + -1];
      other = (dtl_sv_t *)_arrayLen->pAny->pFirst[errorCode];
      if ((pdVar1 == (dtl_sv_t *)0x0) || (other == (dtl_sv_t *)0x0)) {
        __assert_fail("(left != 0) && (right != 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_av.c"
                      ,0xe6,"dtl_error_t dtl_av_insertion_sort(dtl_av_t *, _Bool)");
      }
      dVar3 = dtl_dv_type((dtl_dv_t *)pdVar1);
      dVar4 = dtl_dv_type((dtl_dv_t *)other);
      if ((dVar3 != DTL_DV_SCALAR) || (dVar4 != DTL_DV_SCALAR)) {
        return 4;
      }
      dVar5 = dtl_sv_lt(pdVar1,other,(_Bool *)((long)&leftType + 3));
      if (dVar5 != 0) {
        return dVar5;
      }
      if ((unsortedStart._3_1_ & 1) != 0) {
        leftType._3_1_ = (leftType._3_1_ ^ 0xff) & 1;
      }
      if ((leftType._3_1_ & 1) == DTL_DV_INVALID >> 0x18) {
        _arrayLen->pAny->pFirst[errorCode] = pdVar1;
        iVar2 = errorCode;
        while (local_4c = iVar2 + -1, 0 < local_4c) {
          pdVar1 = (dtl_sv_t *)_arrayLen->pAny->pFirst[iVar2 + -2];
          dVar3 = dtl_dv_type((dtl_dv_t *)pdVar1);
          if (dVar3 != DTL_DV_SCALAR) {
            return 4;
          }
          dVar5 = dtl_sv_lt(pdVar1,other,(_Bool *)((long)&leftType + 3));
          if (dVar5 != 0) {
            return dVar5;
          }
          if ((unsortedStart._3_1_ & 1) != 0) {
            leftType._3_1_ = (leftType._3_1_ ^ 0xff) & 1;
          }
          if ((leftType._3_1_ & 1) != DTL_DV_INVALID >> 0x18) break;
          _arrayLen->pAny->pFirst[local_4c] = pdVar1;
          iVar2 = local_4c;
        }
        _arrayLen->pAny->pFirst[local_4c] = other;
      }
    }
  }
  return 0;
}

Assistant:

static dtl_error_t dtl_av_insertion_sort(dtl_av_t *self, bool reverse)
{
   int32_t arrayLen = self->pAny->s32CurLen;
   if (arrayLen > 1)
   {
      int32_t unsortedStart = 1;

      while(unsortedStart < arrayLen)
      {
         bool result = false;
         dtl_error_t errorCode = DTL_NO_ERROR;
         dtl_dv_type_id leftType, rightType;
         dtl_dv_t *left = self->pAny->pFirst[unsortedStart-1];
         dtl_dv_t *right = self->pAny->pFirst[unsortedStart];
         assert( (left != 0) && (right != 0) );
         leftType = dtl_dv_type(left);
         rightType = dtl_dv_type(right);
         if ( (leftType == DTL_DV_SCALAR) && (rightType == DTL_DV_SCALAR) )
         {
            errorCode = dtl_sv_lt( (dtl_sv_t*) left, (dtl_sv_t*) right, &result);
         }
         else
         {
            return DTL_TYPE_ERROR;
         }

         if (errorCode != DTL_NO_ERROR)
         {
            return errorCode;
         }
         else
         {
            if (reverse)
            {
               result = !result;
            }
            if (result == false)
            {
               int32_t i;
               self->pAny->pFirst[unsortedStart] = left;
               for(i=unsortedStart-1; i>0; i--)
               {
                  left = self->pAny->pFirst[i-1];
                  leftType = dtl_dv_type(left);
                  if ( (leftType == DTL_DV_SCALAR) )
                  {
                     errorCode = dtl_sv_lt( (dtl_sv_t*) left, (dtl_sv_t*) right, &result);
                     if (errorCode != DTL_NO_ERROR)
                     {
                        return errorCode;
                     }
                  }
                  else
                  {
                     return DTL_TYPE_ERROR;
                  }
                  if (reverse)
                  {
                     result = !result;
                  }
                  if (result == false)
                  {
                     self->pAny->pFirst[i] = left;
                  }
                  else
                  {
                     break;
                  }
               }
               self->pAny->pFirst[i] = right;
            }
            unsortedStart++;
         }
      }
   }
   return DTL_NO_ERROR;
}